

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O0

void getBundlePath(char **path,uint *pathLength)

{
  uchar uVar1;
  uint local_2c;
  uint local_28;
  uint bundlePathLength;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *executablePath;
  uint *pathLength_local;
  char **path_local;
  
  executablePath = (char *)pathLength;
  pathLength_local = (uint *)path;
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    _executablePathDirectoryLength = (char *)0x0;
    bundlePathLength = 0;
    getExecutablePath((char **)&executablePathDirectoryLength,&bundlePathLength);
    local_28 = 0;
    getDirectoryPart(_executablePathDirectoryLength,bundlePathLength,&local_28);
    unifyPathDelimiters(_executablePathDirectoryLength,local_28);
    local_2c = 0;
    getBundlePart(_executablePathDirectoryLength,local_28,&local_2c);
    if (local_2c == 0) {
      free(_executablePathDirectoryLength);
      invalidateStringOutParameter((char **)pathLength_local,(uint *)executablePath);
    }
    else {
      copyToStringOutParameter
                (_executablePathDirectoryLength,local_2c,(char **)pathLength_local,
                 (uint *)executablePath);
      free(_executablePathDirectoryLength);
    }
  }
  return;
}

Assistant:

void getBundlePath(char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    // Get directory where the executable is located
    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);

    // Extract directory part from executable path (without trailing slash)
    unsigned int executablePathDirectoryLength = 0;
    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    // Convert to canonical path
    unifyPathDelimiters(executablePath, executablePathDirectoryLength);

    // check for /Contents/MacOS
    unsigned int bundlePathLength = 0;
    getBundlePart(executablePath, executablePathDirectoryLength, &bundlePathLength);

    if (bundlePathLength == 0) // No bundle
    {
        free(executablePath);
        invalidateStringOutParameter(path, pathLength);
        return;
    }

    // Copy contents to caller, create caller ownership
    copyToStringOutParameter(executablePath, bundlePathLength, path, pathLength);

    free(executablePath);
}